

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O3

void __thiscall HdlcAnalyzer::ProcessHDLCFrame(HdlcAnalyzer *this)

{
  pointer puVar1;
  HdlcByte byteAfterFlag;
  HdlcByte local_28;
  
  puVar1 = (this->mCurrentFrameBytes).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  ProcessFlags(&local_28,this);
  byteAfterFlag.endSample = local_28.endSample;
  byteAfterFlag.startSample = local_28.startSample;
  byteAfterFlag.value = local_28.value;
  byteAfterFlag.escaped = local_28.escaped;
  byteAfterFlag._18_6_ = local_28._18_6_;
  ProcessAddressField(this,byteAfterFlag);
  ProcessControlField(this);
  ProcessInfoAndFcsField(this);
  if (this->mAbortFrame == true) {
    std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,&this->mAbtFrame);
    if (((this->mSettings)._M_ptr)->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC) {
      AnalyzerChannelData::AdvanceToNextEdge();
    }
  }
  else {
    std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,&this->mEndFlagFrame)
    ;
  }
  this->mReadingFrame = false;
  this->mAbortFrame = false;
  this->mCurrentFrameIsSFrame = false;
  return;
}

Assistant:

void HdlcAnalyzer::ProcessHDLCFrame()
{
    mCurrentFrameBytes.clear();

    HdlcByte addressByte = ProcessFlags();

    ProcessAddressField( addressByte );
    ProcessControlField();
    ProcessInfoAndFcsField();

    if( mAbortFrame ) // The frame has been aborted at some point
    {
        AddFrameToResults( mAbtFrame );
        if( mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC )
        {
            // After abortion, synchronize again
            mHdlc->AdvanceToNextEdge();
        }
    }
    else
    {
        AddFrameToResults( mEndFlagFrame );
    }

    // Reset state bool variables
    mReadingFrame = false;
    mAbortFrame = false;
    mCurrentFrameIsSFrame = false;
}